

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int cuddSwapInPlace(DdManager *table,int x,int y)

{
  DdHalfWord x_00;
  uint uVar1;
  DdHalfWord y_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  DdHalfWord DVar5;
  DdHalfWord DVar6;
  Cudd_VariableType CVar7;
  Cudd_LazyGroupType CVar8;
  DdNode **__ptr;
  DdNode **ppDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  _func_void_long *p_Var13;
  int iVar14;
  DdNode *pDVar15;
  ulong uVar16;
  bool bVar17;
  uint local_110;
  int local_108;
  uint local_104;
  int newxshift;
  uint newxslots;
  DdNodePtr *newxlist;
  DdNode *h;
  DD_OOMFP saveHandler;
  DdNode *sentinel;
  DdNode *tmp;
  DdNodePtr *previousP;
  DdNode *next;
  DdNode *g;
  DdNode *newf0;
  DdNode *newf1;
  DdNode *f10;
  DdNode *f11;
  DdNode *f00;
  DdNode *f01;
  DdNode *f1;
  DdNode *f0;
  DdNode *f;
  int isolated;
  int posn;
  Cudd_LazyGroupType groupType;
  Cudd_VariableType varType;
  int i;
  int newcomplement;
  int comple;
  int newykeys;
  int newxkeys;
  int oldykeys;
  int oldxkeys;
  int yshift;
  int xshift;
  int yslots;
  int xslots;
  int yindex;
  int xindex;
  DdNodePtr *ylist;
  DdNodePtr *xlist;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  ddTotalNumberSwapping = ddTotalNumberSwapping + 1;
  x_00 = table->invperm[x];
  __ptr = table->subtables[x].nodelist;
  uVar1 = table->subtables[x].keys;
  xshift = table->subtables[x].slots;
  oldxkeys = table->subtables[x].shift;
  y_00 = table->invperm[y];
  ppDVar9 = table->subtables[y].nodelist;
  uVar2 = table->subtables[y].keys;
  uVar3 = table->subtables[y].slots;
  iVar4 = table->subtables[y].shift;
  iVar14 = cuddTestInteract(table,x_00,y_00);
  newcomplement = uVar2;
  comple = uVar1;
  ylist = __ptr;
  if (iVar14 != 0) {
    comple = 0;
    DVar5 = table->vars[(int)x_00]->ref;
    DVar6 = table->vars[(int)y_00]->ref;
    next = (DdNode *)0x0;
    if ((((int)uVar1 < xshift) && (xshift != table->initSlots)) || (xshift * 4 < (int)uVar1)) {
      newxlist = (DdNodePtr *)0x0;
      for (groupType = CUDD_LAZY_NONE; p_Var13 = Extra_UtilMMoutOfMemory, local_108 = oldxkeys,
          local_104 = xshift, (int)groupType < xshift; groupType = groupType + CUDD_LAZY_SOFT_GROUP)
      {
        f0 = __ptr[(int)groupType];
        while ((DdManager *)f0 != table) {
          pDVar10 = f0->next;
          if ((((f0->type).kids.T)->index == y_00) ||
             (*(DdHalfWord *)((ulong)(f0->type).kids.E & 0xfffffffffffffffe) == y_00)) {
            f0->index = y_00;
            f0->next = next;
            next = f0;
            f0 = pDVar10;
          }
          else {
            f0->next = (DdNode *)newxlist;
            newxlist = (DdNodePtr *)f0;
            comple = comple + 1;
            f0 = pDVar10;
          }
        }
      }
      for (; local_104 << 2 < uVar1; local_104 = local_104 << 1) {
        local_108 = local_108 + -1;
      }
      while( true ) {
        bVar17 = false;
        if (uVar1 < local_104) {
          bVar17 = table->initSlots < local_104;
        }
        if (!bVar17) break;
        local_108 = local_108 + 1;
        local_104 = local_104 >> 1;
      }
      Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
      ylist = (DdNodePtr *)malloc((ulong)local_104 << 3);
      Extra_UtilMMoutOfMemory = p_Var13;
      if (ylist == (DdNodePtr *)0x0) {
        fprintf((FILE *)table->err,"Unable to resize subtable %d for lack of memory\n",
                (ulong)groupType);
        local_108 = oldxkeys;
        local_104 = xshift;
        ylist = __ptr;
      }
      else {
        table->slots = table->slots + (local_104 - xshift);
        table->minDead = (uint)(long)(table->gcFrac * (double)table->slots);
        if (table->slots << 2 < table->maxCacheHard) {
          local_110 = table->slots << 2;
        }
        else {
          local_110 = table->maxCacheHard;
        }
        table->cacheSlack = local_110 + table->cacheSlots * -2;
        table->memused = (long)(int)(local_104 - xshift) * 8 + table->memused;
        if (__ptr != (DdNode **)0x0) {
          free(__ptr);
        }
      }
      for (groupType = CUDD_LAZY_NONE; (int)groupType < (int)local_104;
          groupType = groupType + CUDD_LAZY_SOFT_GROUP) {
        ylist[(int)groupType] = &table->sentinel;
      }
      f0 = (DdNode *)newxlist;
      while (oldxkeys = local_108, xshift = local_104, f0 != (DdNode *)0x0) {
        pDVar10 = f0->next;
        pDVar11 = (f0->type).kids.T;
        pDVar12 = (f0->type).kids.E;
        tmp = (DdNode *)
              (ylist + (int)((((uint)(*(long *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 0x20) << 1)
                              | (uint)pDVar11 & 1) * 0xc00005 +
                             ((uint)(*(long *)(((ulong)pDVar12 & 0xfffffffffffffffe) + 0x20) << 1) |
                             (uint)pDVar12 & 1)) * 0x40f1f9 >> ((byte)local_108 & 0x1f)));
        sentinel = *(DdNode **)tmp;
        while (pDVar11 < (sentinel->type).kids.T) {
          tmp = (DdNode *)&sentinel->next;
          sentinel = *(DdNode **)tmp;
        }
        while( true ) {
          bVar17 = false;
          if (pDVar11 == (sentinel->type).kids.T) {
            bVar17 = pDVar12 < (sentinel->type).kids.E;
          }
          if (!bVar17) break;
          tmp = (DdNode *)&sentinel->next;
          sentinel = *(DdNode **)tmp;
        }
        f0->next = *(DdNode **)tmp;
        *(DdNode **)tmp = f0;
        f0 = pDVar10;
      }
    }
    else {
      for (groupType = CUDD_LAZY_NONE; (int)groupType < xshift;
          groupType = groupType + CUDD_LAZY_SOFT_GROUP) {
        tmp = (DdNode *)(__ptr + (int)groupType);
        f0 = *(DdNode **)tmp;
        while ((DdManager *)f0 != table) {
          pDVar10 = f0->next;
          if ((((f0->type).kids.T)->index == y_00) ||
             (*(DdHalfWord *)((ulong)(f0->type).kids.E & 0xfffffffffffffffe) == y_00)) {
            f0->index = y_00;
            f0->next = next;
            next = f0;
            f0 = pDVar10;
          }
          else {
            comple = comple + 1;
            *(DdNode **)tmp = f0;
            tmp = (DdNode *)&f0->next;
            f0 = pDVar10;
          }
        }
        *(DdManager **)tmp = table;
      }
    }
    f0 = next;
    while (f0 != (DdNode *)0x0) {
      pDVar10 = f0->next;
      pDVar11 = (f0->type).kids.T;
      newf1 = pDVar11;
      f10 = pDVar11;
      if (pDVar11->index == y_00) {
        newf1 = (pDVar11->type).kids.E;
        f10 = (pDVar11->type).kids.T;
      }
      pDVar12 = (f0->type).kids.E;
      pDVar15 = (DdNode *)((ulong)pDVar12 & 0xfffffffffffffffe);
      f11 = pDVar15;
      f00 = pDVar15;
      if (pDVar15->index == y_00) {
        f11 = (pDVar15->type).kids.E;
        f00 = (pDVar15->type).kids.T;
      }
      if (((ulong)pDVar12 & 1) != 0) {
        f00 = (DdNode *)((ulong)f00 ^ 1);
        f11 = (DdNode *)((ulong)f11 ^ 1);
      }
      pDVar11->ref = pDVar11->ref - 1;
      if (f10 == f00) {
        newf0 = f10;
        f10->ref = f10->ref + 1;
      }
      else {
        tmp = (DdNode *)
              (ylist + (int)((((uint)(*(long *)(((ulong)f10 & 0xfffffffffffffffe) + 0x20) << 1) |
                              (uint)f10 & 1) * 0xc00005 +
                             ((uint)(*(long *)(((ulong)f00 & 0xfffffffffffffffe) + 0x20) << 1) |
                             (uint)f00 & 1)) * 0x40f1f9 >> ((byte)oldxkeys & 0x1f)));
        newf0 = *(DdNode **)tmp;
        while (f10 < (newf0->type).kids.T) {
          tmp = (DdNode *)&newf0->next;
          newf0 = *(DdNode **)tmp;
        }
        while( true ) {
          bVar17 = false;
          if (f10 == (newf0->type).kids.T) {
            bVar17 = f00 < (newf0->type).kids.E;
          }
          if (!bVar17) break;
          tmp = (DdNode *)&newf0->next;
          newf0 = *(DdNode **)tmp;
        }
        if (((newf0->type).kids.T == f10) && ((newf0->type).kids.E == f00)) {
          newf0->ref = newf0->ref + 1;
        }
        else {
          newf0 = cuddDynamicAllocNode(table);
          if (newf0 == (DdNode *)0x0) goto LAB_00a6a37f;
          newf0->index = x_00;
          newf0->ref = 1;
          (newf0->type).kids.T = f10;
          (newf0->type).kids.E = f00;
          comple = comple + 1;
          newf0->next = *(DdNode **)tmp;
          *(DdNode **)tmp = newf0;
          f10->ref = f10->ref + 1;
          *(int *)(((ulong)f00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)f00 & 0xfffffffffffffffe) + 4) + 1;
        }
      }
      (f0->type).kids.T = newf0;
      pDVar15->ref = pDVar15->ref - 1;
      if (newf1 == f11) {
        g = f11;
        *(int *)(((ulong)f11 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)f11 & 0xfffffffffffffffe) + 4) + 1;
      }
      else {
        uVar16 = (ulong)newf1 & 1;
        if (((ulong)newf1 & 1) != 0) {
          newf1 = (DdNode *)((ulong)newf1 ^ 1);
          f11 = (DdNode *)((ulong)f11 ^ 1);
        }
        tmp = (DdNode *)
              (ylist + (int)((((uint)(*(long *)(((ulong)newf1 & 0xfffffffffffffffe) + 0x20) << 1) |
                              (uint)newf1 & 1) * 0xc00005 +
                             ((uint)(*(long *)(((ulong)f11 & 0xfffffffffffffffe) + 0x20) << 1) |
                             (uint)f11 & 1)) * 0x40f1f9 >> ((byte)oldxkeys & 0x1f)));
        g = *(DdNode **)tmp;
        while (newf1 < (g->type).kids.T) {
          tmp = (DdNode *)&g->next;
          g = *(DdNode **)tmp;
        }
        while( true ) {
          bVar17 = false;
          if (newf1 == (g->type).kids.T) {
            bVar17 = f11 < (g->type).kids.E;
          }
          if (!bVar17) break;
          tmp = (DdNode *)&g->next;
          g = *(DdNode **)tmp;
        }
        if (((g->type).kids.T == newf1) && ((g->type).kids.E == f11)) {
          g->ref = g->ref + 1;
        }
        else {
          g = cuddDynamicAllocNode(table);
          if (g == (DdNode *)0x0) {
LAB_00a6a37f:
            fprintf((FILE *)table->err,"Error: cuddSwapInPlace out of memory\n");
            return 0;
          }
          g->index = x_00;
          g->ref = 1;
          (g->type).kids.T = newf1;
          (g->type).kids.E = f11;
          comple = comple + 1;
          g->next = *(DdNode **)tmp;
          *(DdNode **)tmp = g;
          newf1->ref = newf1->ref + 1;
          *(int *)(((ulong)f11 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)f11 & 0xfffffffffffffffe) + 4) + 1;
        }
        if (uVar16 != 0) {
          g = (DdNode *)((ulong)g ^ 1);
        }
      }
      (f0->type).kids.E = g;
      newcomplement = newcomplement + 1;
      tmp = (DdNode *)
            (ppDVar9 +
            (int)((((uint)(*(long *)(((ulong)newf0 & 0xfffffffffffffffe) + 0x20) << 1) |
                   (uint)newf0 & 1) * 0xc00005 +
                  ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1)) *
                  0x40f1f9 >> ((byte)iVar4 & 0x1f)));
      sentinel = *(DdNode **)tmp;
      while (newf0 < (sentinel->type).kids.T) {
        tmp = (DdNode *)&sentinel->next;
        sentinel = *(DdNode **)tmp;
      }
      while( true ) {
        bVar17 = false;
        if (newf0 == (sentinel->type).kids.T) {
          bVar17 = g < (sentinel->type).kids.E;
        }
        if (!bVar17) break;
        tmp = (DdNode *)&sentinel->next;
        sentinel = *(DdNode **)tmp;
      }
      f0->next = *(DdNode **)tmp;
      *(DdNode **)tmp = f0;
      f0 = pDVar10;
    }
    for (groupType = CUDD_LAZY_NONE; (int)groupType < (int)uVar3;
        groupType = groupType + CUDD_LAZY_SOFT_GROUP) {
      tmp = (DdNode *)(ppDVar9 + (int)groupType);
      f0 = *(DdNode **)tmp;
      while ((DdManager *)f0 != table) {
        pDVar10 = f0->next;
        if (f0->ref == 0) {
          pDVar11 = (f0->type).kids.T;
          pDVar11->ref = pDVar11->ref - 1;
          uVar16 = (ulong)(f0->type).kids.E & 0xfffffffffffffffe;
          *(int *)(uVar16 + 4) = *(int *)(uVar16 + 4) + -1;
          f0->next = table->nextFree;
          table->nextFree = f0;
          newcomplement = newcomplement + -1;
          f0 = pDVar10;
        }
        else {
          *(DdNode **)tmp = f0;
          tmp = (DdNode *)&f0->next;
          f0 = pDVar10;
        }
      }
      *(DdManager **)tmp = table;
    }
    table->isolated =
         (((uint)(table->vars[(int)x_00]->ref == 1) + (uint)(table->vars[(int)y_00]->ref == 1)) -
         ((uint)(DVar5 == 1) + (uint)(DVar6 == 1))) + table->isolated;
  }
  table->subtables[x].nodelist = ppDVar9;
  table->subtables[x].slots = uVar3;
  table->subtables[x].shift = iVar4;
  table->subtables[x].keys = newcomplement;
  table->subtables[x].maxKeys = uVar3 << 2;
  iVar4 = table->subtables[x].bindVar;
  table->subtables[x].bindVar = table->subtables[y].bindVar;
  table->subtables[y].bindVar = iVar4;
  CVar7 = table->subtables[x].varType;
  table->subtables[x].varType = table->subtables[y].varType;
  table->subtables[y].varType = CVar7;
  iVar4 = table->subtables[x].pairIndex;
  table->subtables[x].pairIndex = table->subtables[y].pairIndex;
  table->subtables[y].pairIndex = iVar4;
  iVar4 = table->subtables[x].varHandled;
  table->subtables[x].varHandled = table->subtables[y].varHandled;
  table->subtables[y].varHandled = iVar4;
  CVar8 = table->subtables[x].varToBeGrouped;
  table->subtables[x].varToBeGrouped = table->subtables[y].varToBeGrouped;
  table->subtables[y].varToBeGrouped = CVar8;
  table->subtables[y].nodelist = ylist;
  table->subtables[y].slots = xshift;
  table->subtables[y].shift = oldxkeys;
  table->subtables[y].keys = comple;
  table->subtables[y].maxKeys = xshift << 2;
  table->perm[(int)x_00] = y;
  table->perm[(int)y_00] = x;
  table->invperm[x] = y_00;
  table->invperm[y] = x_00;
  table->keys = (((comple + newcomplement) - uVar1) - uVar2) + table->keys;
  return table->keys - table->isolated;
}

Assistant:

int
cuddSwapInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int    xindex, yindex;
    int    xslots, yslots;
    int    xshift, yshift;
    int    oldxkeys, oldykeys;
    int    newxkeys, newykeys;
    int    comple, newcomplement;
    int    i;
    Cudd_VariableType varType;
    Cudd_LazyGroupType groupType;
    int    posn;
    int    isolated;
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10,*newf1,*newf0;
    DdNode *g,*next;
    DdNodePtr *previousP;
    DdNode *tmp;
    DdNode *sentinel = &(table->sentinel);
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

#ifdef DD_DEBUG
    int    count,idcheck;
#endif

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddNextHigh(table,x) == y);
    assert(table->subtables[x].keys != 0);
    assert(table->subtables[y].keys != 0);
    assert(table->subtables[x].dead == 0);
    assert(table->subtables[y].dead == 0);
#endif

    ddTotalNumberSwapping++;

    /* Get parameters of x subtable. */
    xindex = table->invperm[x];
    xlist = table->subtables[x].nodelist;
    oldxkeys = table->subtables[x].keys;
    xslots = table->subtables[x].slots;
    xshift = table->subtables[x].shift;

    /* Get parameters of y subtable. */
    yindex = table->invperm[y];
    ylist = table->subtables[y].nodelist;
    oldykeys = table->subtables[y].keys;
    yslots = table->subtables[y].slots;
    yshift = table->subtables[y].shift;

    if (!cuddTestInteract(table,xindex,yindex)) {
#ifdef DD_STATS
        ddTotalNISwaps++;
#endif
        newxkeys = oldxkeys;
        newykeys = oldykeys;
    } else {
        newxkeys = 0;
        newykeys = oldykeys;

        /* Check whether the two projection functions involved in this
        ** swap are isolated. At the end, we'll be able to tell how many
        ** isolated projection functions are there by checking only these
        ** two functions again. This is done to eliminate the isolated
        ** projection functions from the node count.
        */
        isolated = - ((table->vars[xindex]->ref == 1) +
                     (table->vars[yindex]->ref == 1));

        /* The nodes in the x layer that do not depend on
        ** y will stay there; the others are put in a chain.
        ** The chain is handled as a LIFO; g points to the beginning.
        */
        g = NULL;
        if ((oldxkeys >= xslots || (unsigned) xslots == table->initSlots) &&
            oldxkeys <= DD_MAX_SUBTABLE_DENSITY * xslots) {
            for (i = 0; i < xslots; i++) {
                previousP = &(xlist[i]);
                f = *previousP;
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        newxkeys++;
                        *previousP = f;
                        previousP = &(f->next);
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
                *previousP = sentinel;
            } /* for each slot of the x subtable */
        } else {                /* resize xlist */
            DdNode *h = NULL;
            DdNodePtr *newxlist;
            unsigned int newxslots;
            int newxshift;
            /* Empty current xlist. Nodes that stay go to list h;
            ** nodes that move go to list g. */
            for (i = 0; i < xslots; i++) {
                f = xlist[i];
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        f->next = h;
                        h = f;
                        newxkeys++;
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
            } /* for each slot of the x subtable */
            /* Decide size of new subtable. */
            newxshift = xshift;
            newxslots = xslots;
            while ((unsigned) oldxkeys > DD_MAX_SUBTABLE_DENSITY * newxslots) {
                newxshift--;
                newxslots <<= 1;
            }
            while ((unsigned) oldxkeys < newxslots &&
                   newxslots > table->initSlots) {
                newxshift++;
                newxslots >>= 1;
            }
            /* Try to allocate new table. Be ready to back off. */
            saveHandler = MMoutOfMemory;
            MMoutOfMemory = Cudd_OutOfMem;
            newxlist = ABC_ALLOC(DdNodePtr, newxslots);
            MMoutOfMemory = saveHandler;
            if (newxlist == NULL) {
                (void) fprintf(table->err, "Unable to resize subtable %d for lack of memory\n", i);
                newxlist = xlist;
                newxslots = xslots;
                newxshift = xshift;
            } else {
                table->slots += ((int) newxslots - xslots);
                table->minDead = (unsigned)
                    (table->gcFrac * (double) table->slots);
                table->cacheSlack = (int)
                    ddMin(table->maxCacheHard, DD_MAX_CACHE_TO_SLOTS_RATIO
                          * table->slots) - 2 * (int) table->cacheSlots;
                table->memused +=
                    ((int) newxslots - xslots) * sizeof(DdNodePtr);
                ABC_FREE(xlist);
                xslots =  newxslots;
                xshift = newxshift;
                xlist = newxlist;
            }
            /* Initialize new subtable. */
            for (i = 0; i < xslots; i++) {
                xlist[i] = sentinel;
            }
            /* Move nodes that were parked in list h to their new home. */
            f = h;
            while (f != NULL) {
                next = f->next;
                f1 = cuddT(f);
                f0 = cuddE(f);
                /* Check xlist for pair (f11,f01). */
                posn = ddHash(cuddF2L(f1), cuddF2L(f0), xshift);
                /* For each element tmp in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                tmp = *previousP;
                while (f1 < cuddT(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                while (f1 == cuddT(tmp) && f0 < cuddE(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                f->next = *previousP;
                *previousP = f;
                f = next;
            }
        }

#ifdef DD_COUNT
        table->swapSteps += oldxkeys - newxkeys;
#endif
        /* Take care of the x nodes that must be re-expressed.
        ** They form a linked list pointed by g. Their index has been
        ** already changed to yindex.
        */
        f = g;
        while (f != NULL) {
            next = f->next;
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f1)));
#endif
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                f11 = f10 = f1;
            }
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f11)));
#endif
            f0 = cuddE(f);
            comple = Cudd_IsComplement(f0);
            f0 = Cudd_Regular(f0);
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }
            /* Decrease ref count of f1. */
            cuddSatDec(f1->ref);
            /* Create the new T child. */
            if (f11 == f01) {
                newf1 = f11;
                cuddSatInc(newf1->ref);
            } else {
                /* Check xlist for triple (xindex,f11,f01). */
                posn = ddHash(cuddF2L(f11), cuddF2L(f01), xshift);
                /* For each element newf1 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf1 = *previousP;
                while (f11 < cuddT(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                while (f11 == cuddT(newf1) && f01 < cuddE(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                if (cuddT(newf1) == f11 && cuddE(newf1) == f01) {
                    cuddSatInc(newf1->ref);
                } else { /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto cuddSwapOutOfMem;
                    newf1->index = xindex; newf1->ref = 1;
                    cuddT(newf1) = f11;
                    cuddE(newf1) = f01;
                    /* Insert newf1 in the collision list xlist[posn];
                    ** increase the ref counts of f11 and f01.
                    */
                    newxkeys++;
                    newf1->next = *previousP;
                    *previousP = newf1;
                    cuddSatInc(f11->ref);
                    tmp = Cudd_Regular(f01);
                    cuddSatInc(tmp->ref);
                }
            }
            cuddT(f) = newf1;
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(newf1)));
#endif

            /* Do the same for f0, keeping complement dots into account. */
            /* Decrease ref count of f0. */
            tmp = Cudd_Regular(f0);
            cuddSatDec(tmp->ref);
            /* Create the new E child. */
            if (f10 == f00) {
                newf0 = f00;
                tmp = Cudd_Regular(newf0);
                cuddSatInc(tmp->ref);
            } else {
                /* make sure f10 is regular */
                newcomplement = Cudd_IsComplement(f10);
                if (newcomplement) {
                    f10 = Cudd_Not(f10);
                    f00 = Cudd_Not(f00);
                }
                /* Check xlist for triple (xindex,f10,f00). */
                posn = ddHash(cuddF2L(f10), cuddF2L(f00), xshift);
                /* For each element newf0 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf0 = *previousP;
                while (f10 < cuddT(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                while (f10 == cuddT(newf0) && f00 < cuddE(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                if (cuddT(newf0) == f10 && cuddE(newf0) == f00) {
                    cuddSatInc(newf0->ref);
                } else { /* no match */
                    newf0 = cuddDynamicAllocNode(table);
                    if (newf0 == NULL)
                        goto cuddSwapOutOfMem;
                    newf0->index = xindex; newf0->ref = 1;
                    cuddT(newf0) = f10;
                    cuddE(newf0) = f00;
                    /* Insert newf0 in the collision list xlist[posn];
                    ** increase the ref counts of f10 and f00.
                    */
                    newxkeys++;
                    newf0->next = *previousP;
                    *previousP = newf0;
                    cuddSatInc(f10->ref);
                    tmp = Cudd_Regular(f00);
                    cuddSatInc(tmp->ref);
                }
                if (newcomplement) {
                    newf0 = Cudd_Not(newf0);
                }
            }
            cuddE(f) = newf0;

            /* Insert the modified f in ylist.
            ** The modified f does not already exists in ylist.
            ** (Because of the uniqueness of the cofactors.)
            */
            posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), yshift);
            newykeys++;
            previousP = &(ylist[posn]);
            tmp = *previousP;
            while (newf1 < cuddT(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            while (newf1 == cuddT(tmp) && newf0 < cuddE(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            f->next = *previousP;
            *previousP = f;
            f = next;
        } /* while f != NULL */

        /* GC the y layer. */

        /* For each node f in ylist. */
        for (i = 0; i < yslots; i++) {
            previousP = &(ylist[i]);
            f = *previousP;
            while (f != sentinel) {
                next = f->next;
                if (f->ref == 0) {
                    tmp = cuddT(f);
                    cuddSatDec(tmp->ref);
                    tmp = Cudd_Regular(cuddE(f));
                    cuddSatDec(tmp->ref);
                    cuddDeallocNode(table,f);
                    newykeys--;
                } else {
                    *previousP = f;
                    previousP = &(f->next);
                }
                f = next;
            } /* while f */
            *previousP = sentinel;
        } /* for i */

#ifdef DD_DEBUG
#if 0
        (void) fprintf(table->out,"Swapping %d and %d\n",x,y);
#endif
        count = 0;
        idcheck = 0;
        for (i = 0; i < yslots; i++) {
            f = ylist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) yindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newykeys) {
            (void) fprintf(table->out,
                           "Error in finding newykeys\toldykeys = %d\tnewykeys = %d\tactual = %d\n",
                           oldykeys,newykeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of ylist\twrong id's = %d\n",
                           idcheck);
        count = 0;
        idcheck = 0;
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) xindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newxkeys) {
            (void) fprintf(table->out,
                           "Error in finding newxkeys\toldxkeys = %d \tnewxkeys = %d \tactual = %d\n",
                           oldxkeys,newxkeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of xlist\twrong id's = %d\n",
                           idcheck);
#endif

        isolated += (table->vars[xindex]->ref == 1) +
                    (table->vars[yindex]->ref == 1);
        table->isolated += isolated;
    }

    /* Set the appropriate fields in table. */
    table->subtables[x].nodelist = ylist;
    table->subtables[x].slots = yslots;
    table->subtables[x].shift = yshift;
    table->subtables[x].keys = newykeys;
    table->subtables[x].maxKeys = yslots * DD_MAX_SUBTABLE_DENSITY;
    i = table->subtables[x].bindVar;
    table->subtables[x].bindVar = table->subtables[y].bindVar;
    table->subtables[y].bindVar = i;
    /* Adjust filds for lazy sifting. */
    varType = table->subtables[x].varType;
    table->subtables[x].varType = table->subtables[y].varType;
    table->subtables[y].varType = varType;
    i = table->subtables[x].pairIndex;
    table->subtables[x].pairIndex = table->subtables[y].pairIndex;
    table->subtables[y].pairIndex = i;
    i = table->subtables[x].varHandled;
    table->subtables[x].varHandled = table->subtables[y].varHandled;
    table->subtables[y].varHandled = i;
    groupType = table->subtables[x].varToBeGrouped;
    table->subtables[x].varToBeGrouped = table->subtables[y].varToBeGrouped;
    table->subtables[y].varToBeGrouped = groupType;

    table->subtables[y].nodelist = xlist;
    table->subtables[y].slots = xslots;
    table->subtables[y].shift = xshift;
    table->subtables[y].keys = newxkeys;
    table->subtables[y].maxKeys = xslots * DD_MAX_SUBTABLE_DENSITY;

    table->perm[xindex] = y; table->perm[yindex] = x;
    table->invperm[x] = yindex; table->invperm[y] = xindex;

    table->keys += newxkeys + newykeys - oldxkeys - oldykeys;

    return(table->keys - table->isolated);

cuddSwapOutOfMem:
    (void) fprintf(table->err,"Error: cuddSwapInPlace out of memory\n");

    return (0);

}